

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O0

void __thiscall pcplusplus::threads::generic_threads::~generic_threads(generic_threads *this)

{
  byte bVar1;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  *in_RDI = &PTR_thread_routine_0010bca8;
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::ofstream::close();
  }
  std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::reset
            ((unique_ptr<std::thread[],_std::default_delete<std::thread[]>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffff0),in_RDI);
  std::ofstream::~ofstream(in_RDI + 0xc);
  std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::~unique_ptr
            ((unique_ptr<std::thread[],_std::default_delete<std::thread[]>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffff0));
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  return;
}

Assistant:

virtual ~generic_threads(){
		if(logfile.is_open())
		    logfile.close();
		threads.reset(nullptr);
	    }